

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O3

void duckdb::HistogramBinFinalizeFunction<duckdb::HistogramFunctor,unsigned_int>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar6;
  undefined8 uVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  bool bVar9;
  Value *pVVar10;
  LogicalType *type;
  ulong uVar11;
  ulong uVar12;
  TemplatedValidityData<unsigned_long> *pTVar13;
  _Head_base<0UL,_unsigned_long_*,_false> _Var14;
  long *plVar15;
  idx_t iVar16;
  idx_t iVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  long *plVar22;
  UnifiedVectorFormat sdata;
  unsigned_long local_c8;
  long *local_c0;
  long local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  undefined8 local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
  duckdb::Vector::ToUnifiedFormat((ulong)state_vector,(UnifiedVectorFormat *)count);
  FlatVector::VerifyFlatVector(result);
  pVVar10 = (Value *)duckdb::ListVector::GetListSize(result);
  type = (LogicalType *)duckdb::MapType::KeyType((LogicalType *)(result + 8));
  bVar9 = SupportsOtherBucket(type);
  if (count == 0) {
    lVar20 = 0;
  }
  else {
    lVar20 = 0;
    iVar16 = 0;
    do {
      iVar17 = iVar16;
      if (*local_c0 != 0) {
        iVar17 = (idx_t)*(uint *)(*local_c0 + iVar16 * 4);
      }
      plVar22 = *(long **)(local_b8 + iVar17 * 8);
      plVar15 = (long *)*plVar22;
      if (plVar15 != (long *)0x0) {
        lVar20 = (ulong)(*(long *)(*(long *)(plVar22[1] + 8) + -8) != 0 && bVar9) +
                 (plVar15[1] - *plVar15 >> 2) + lVar20;
      }
      iVar16 = iVar16 + 1;
    } while (count != iVar16);
  }
  duckdb::ListVector::Reserve(result,(ulong)(pVVar10 + lVar20));
  uVar11 = duckdb::MapVector::GetKeys(result);
  lVar20 = duckdb::MapVector::GetValues(result);
  if (count != 0) {
    lVar2 = *(long *)(result + 0x20);
    lVar20 = *(long *)(lVar20 + 0x20);
    uVar19 = 0;
    do {
      uVar12 = uVar19;
      if (*local_c0 != 0) {
        uVar12 = (ulong)*(uint *)(*local_c0 + uVar19 * 4);
      }
      uVar1 = offset + uVar19;
      plVar22 = *(long **)(local_b8 + uVar12 * 8);
      plVar15 = (long *)*plVar22;
      if (plVar15 == (long *)0x0) {
        _Var14._M_head_impl = *(unsigned_long **)(result + 0x28);
        if (_Var14._M_head_impl == (unsigned_long *)0x0) {
          local_c8 = *(unsigned_long *)(result + 0x40);
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_78,&local_c8);
          p_Var8 = p_Stack_70;
          uVar7 = local_78;
          local_78 = 0;
          p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
          *(undefined8 *)(result + 0x30) = uVar7;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var8;
          if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
             p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
          }
          pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (result + 0x30));
          _Var14._M_head_impl =
               (pTVar13->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          *(unsigned_long **)(result + 0x28) = _Var14._M_head_impl;
        }
        bVar6 = (byte)uVar1 & 0x3f;
        _Var14._M_head_impl[uVar1 >> 6] =
             _Var14._M_head_impl[uVar1 >> 6] & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
      }
      else {
        *(Value **)(lVar2 + uVar1 * 0x10) = pVVar10;
        lVar3 = *plVar15;
        lVar18 = plVar15[1] - lVar3;
        if (lVar18 == 0) {
          plVar15 = (long *)plVar22[1];
        }
        else {
          lVar18 = lVar18 >> 2;
          plVar15 = (long *)plVar22[1];
          lVar4 = *plVar15;
          lVar5 = *(long *)(uVar11 + 0x20);
          lVar21 = 0;
          do {
            *(undefined4 *)((long)pVVar10 * 4 + lVar5 + lVar21 * 4) =
                 *(undefined4 *)(lVar3 + lVar21 * 4);
            *(undefined8 *)(lVar20 + (long)pVVar10 * 8 + lVar21 * 8) =
                 *(undefined8 *)(lVar4 + lVar21 * 8);
            lVar21 = lVar21 + 1;
          } while (lVar18 + (ulong)(lVar18 == 0) != lVar21);
          pVVar10 = pVVar10 + lVar21;
        }
        if (bVar9 && *(long *)(plVar15[1] + -8) != 0) {
          OtherBucketValue((duckdb *)&local_78,(LogicalType *)(uVar11 + 8));
          duckdb::Vector::SetValue(uVar11,pVVar10);
          duckdb::Value::~Value((Value *)&local_78);
          *(undefined8 *)(lVar20 + (long)pVVar10 * 8) =
               *(undefined8 *)(*(long *)(plVar22[1] + 8) + -8);
          pVVar10 = pVVar10 + 1;
        }
        plVar22 = (long *)(uVar1 * 0x10 + lVar2);
        plVar22[1] = (long)pVVar10 - *plVar22;
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != count);
  }
  duckdb::ListVector::SetListSize(result,(ulong)pVVar10);
  duckdb::Vector::Verify((ulong)result);
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
  }
  return;
}

Assistant:

static void HistogramBinFinalizeFunction(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count,
                                         idx_t offset) {
	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);
	auto states = UnifiedVectorFormat::GetData<HistogramBinState<T> *>(sdata);

	auto &mask = FlatVector::Validity(result);
	auto old_len = ListVector::GetListSize(result);
	idx_t new_entries = 0;
	bool supports_other_bucket = SupportsOtherBucket(MapType::KeyType(result.GetType()));
	// figure out how much space we need
	for (idx_t i = 0; i < count; i++) {
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.bin_boundaries) {
			continue;
		}
		new_entries += state.bin_boundaries->size();
		if (state.counts->back() > 0 && supports_other_bucket) {
			// overflow bucket has entries
			new_entries++;
		}
	}
	// reserve space in the list vector
	ListVector::Reserve(result, old_len + new_entries);
	auto &keys = MapVector::GetKeys(result);
	auto &values = MapVector::GetValues(result);
	auto list_entries = FlatVector::GetData<list_entry_t>(result);
	auto count_entries = FlatVector::GetData<uint64_t>(values);

	idx_t current_offset = old_len;
	for (idx_t i = 0; i < count; i++) {
		const auto rid = i + offset;
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.bin_boundaries) {
			mask.SetInvalid(rid);
			continue;
		}

		auto &list_entry = list_entries[rid];
		list_entry.offset = current_offset;
		for (idx_t bin_idx = 0; bin_idx < state.bin_boundaries->size(); bin_idx++) {
			OP::template HistogramFinalize<T>((*state.bin_boundaries)[bin_idx], keys, current_offset);
			count_entries[current_offset] = (*state.counts)[bin_idx];
			current_offset++;
		}
		if (state.counts->back() > 0 && supports_other_bucket) {
			// add overflow bucket ("others")
			// set bin boundary to NULL for overflow bucket
			keys.SetValue(current_offset, OtherBucketValue(keys.GetType()));
			count_entries[current_offset] = state.counts->back();
			current_offset++;
		}
		list_entry.length = current_offset - list_entry.offset;
	}
	D_ASSERT(current_offset == old_len + new_entries);
	ListVector::SetListSize(result, current_offset);
	result.Verify(count);
}